

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int fd [2];
  Configurable config;
  uint local_3b8 [2];
  Configurable local_3b0;
  
  memset(&local_3b0,0,0x398);
  local_3b0.errors = _stderr;
  local_3b8[0] = 0;
  local_3b8[1] = 0;
  while ((local_3b8[0] < 3 || (local_3b8[1] < 3))) {
    iVar1 = pipe((int *)local_3b8);
    if (iVar1 < 0) {
LAB_0010ca5a:
      iVar1 = operate(&local_3b0,argc,argv);
      free_config_fields(&local_3b0);
      return iVar1;
    }
  }
  close(local_3b8[0]);
  close(local_3b8[1]);
  goto LAB_0010ca5a;
}

Assistant:

int main(int argc, char *argv[])
{
  int res;
  struct Configurable config;

  memset(&config, 0, sizeof(struct Configurable));

  config.errors = stderr; /* default errors to stderr */

  main_checkfds();

  res = operate(&config, argc, argv);

#ifdef __SYMBIAN32__
  if(config.showerror)
    tool_pressanykey();
#endif

  free_config_fields(&config);

#ifdef __NOVELL_LIBC__
  if(getenv("_IN_NETWARE_BASH_") == NULL)
    tool_pressanykey();
#endif

#ifdef __VMS
  vms_special_exit(res, vms_show);
#else
  return res;
#endif
}